

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaReleaseLast(ExtensionSet *this,int number)

{
  CppType CVar1;
  Extension *pEVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar3;
  char *failure_msg;
  int line;
  LogMessage LStack_18;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x397,"extension != nullptr");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_18,(char (*) [38])"Index out-of-bounds (field is empty).");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_18);
  }
  if (pEVar2->is_repeated == false) {
    failure_msg = "extension->is_repeated";
    line = 0x398;
  }
  else {
    CVar1 = anon_unknown_59::cpp_type(pEVar2->type);
    if (CVar1 == CPPTYPE_MESSAGE) {
      pVVar3 = RepeatedPtrFieldBase::
               UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                         ((RepeatedPtrFieldBase *)pEVar2->field_0);
      return pVVar3;
    }
    failure_msg = "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE";
    line = 0x399;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) {
  const auto* const_this = this;
  return const_cast<ExtensionSet::Extension*>(const_this->FindOrNull(key));
}